

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

pool_ptr<soul::heart::Expression> __thiscall
soul::heart::Parser::parseVariableExpression(Parser *this,FunctionParseState *state)

{
  bool bVar1;
  Variable *lhs;
  Expression *o;
  FunctionParseState *in_RDX;
  pool_ptr<soul::heart::Variable> v;
  FunctionParseState *state_local;
  Parser *this_local;
  
  v.object = (Variable *)anon_var_dwarf_d457d;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     *)state,(TokenType)"$variableIdentifier");
  if (bVar1) {
    findVariable((Parser *)&stack0xffffffffffffffd0,state,(string *)in_RDX);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&stack0xffffffffffffffd0);
    if (bVar1) {
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            *)state);
      lhs = pool_ptr<soul::heart::Variable>::operator*
                      ((pool_ptr<soul::heart::Variable> *)&stack0xffffffffffffffd0);
      o = parseSuffixOperators((Parser *)state,in_RDX,&lhs->super_Expression);
      pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>
                ((pool_ptr<soul::heart::Expression> *)this,o);
    }
    pool_ptr<soul::heart::Variable>::~pool_ptr
              ((pool_ptr<soul::heart::Variable> *)&stack0xffffffffffffffd0);
    if (bVar1) {
      return (pool_ptr<soul::heart::Expression>)(Expression *)this;
    }
  }
  pool_ptr<soul::heart::Expression>::pool_ptr((pool_ptr<soul::heart::Expression> *)this);
  return (pool_ptr<soul::heart::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<heart::Expression> parseVariableExpression (const FunctionParseState& state)
    {
        if (matches (Token::variableIdentifier))
        {
            if (auto v = findVariable (state, currentStringValue))
            {
                skip();
                return parseSuffixOperators (state, *v);
            }
        }

        return {};
    }